

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O3

void la_dgemm_nnoe(int m,int n,int k,double alpha,double *a,int lda,double *b,int ldb,double beta,
                  double *c,int ldc,double *d,int ldd)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x189,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x18a,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x18b,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (a == d) {
    __assert_fail("a != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x18c,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (b == d) {
    __assert_fail("b != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x18d,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (c == d) {
    __assert_fail("c != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x18e,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (m < 0) {
    __assert_fail("m >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,399,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (-1 < n) {
    if (k < 0) {
      __assert_fail("k >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x191,
                    "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((lda < 1) || (lda < m)) {
      __assert_fail("lda >= 1 && lda >= m",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x192,
                    "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((ldb < 1) || (ldb < n)) {
      __assert_fail("ldb >= 1 && ldb >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x193,
                    "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldc) && (n <= ldc)) {
      if ((0 < ldd) && (n <= ldd)) {
        if (m != 0) {
          uVar6 = 0;
          do {
            if (n != 0) {
              uVar2 = 0;
              pdVar5 = b;
              do {
                lVar1 = uVar2 + uVar6 * (uint)ldc;
                dVar7 = c[lVar1] * beta;
                if (k != 0) {
                  uVar4 = 0;
                  pdVar3 = pdVar5;
                  do {
                    dVar7 = dVar7 + a[uVar4] * alpha * *pdVar3;
                    uVar4 = uVar4 + 1;
                    pdVar3 = pdVar3 + (uint)ldb;
                  } while ((uint)k != uVar4);
                }
                d[lVar1] = dVar7;
                uVar2 = uVar2 + 1;
                pdVar5 = pdVar5 + 1;
              } while (uVar2 != (uint)n);
            }
            uVar6 = uVar6 + 1;
            a = a + (uint)lda;
          } while (uVar6 != (uint)m);
        }
        return;
      }
      __assert_fail("ldd >= 1 && ldd >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x195,
                    "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    __assert_fail("ldc >= 1 && ldc >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x194,
                  "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,400,
                "void la_dgemm_nnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemm_nnoe(
        int m, int n, int k,
        double alpha,
        const double *a, int lda,
        const double *b, int ldb,
        double beta,
        const double *c, int ldc,
        double *d, int ldd)
{
    assert(a);
    assert(b);
    assert(c);
    assert(a != d);
    assert(b != d);
    assert(c != d);
    assert(m >= 0);
    assert(n >= 0);
    assert(k >= 0);
    assert(lda >= 1 && lda >= m);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);
    assert(ldd >= 1 && ldd >= n);

    for (int i_ = 0; i_ < m; i_++) {
        for (int j_ = 0; j_ < n; j_++) {
            double dij = beta * c[i_ * ldc + j_];
            for (int k_ = 0; k_ < k; k_++) {
                dij += alpha * a[i_ * lda + k_] * b[k_ * ldb + j_];
            }
            d[i_ * ldc + j_] = dij;
        }
    }
}